

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_location_handler.c
# Opt level: O0

cio_error send_upgrade_response(cio_http_client *client)

{
  char *__s;
  cio_error cVar1;
  cio_write_buffer *wbe;
  size_t length;
  char *chosen_subprotocol;
  uint8_t sha1_buffer [20];
  cio_websocket_location_handler *websocket;
  sha1_context context;
  cio_http_client *client_local;
  
  context._96_8_ = client;
  sha1_reset((sha1_context *)&websocket);
  unique0x00012000 = *(long *)(context._96_8_ + 0xf0);
  sha1_input((sha1_context *)&websocket,(uint8_t *)(unique0x00012000 + 0x70),0x3c);
  sha1_result((sha1_context *)&websocket,(uint8_t *)&chosen_subprotocol);
  cio_b64_encode_buffer((uint8_t *)&chosen_subprotocol,0x14,(char *)(stack0xffffffffffffff80 + 200))
  ;
  *(undefined1 *)(stack0xffffffffffffff80 + 0xe4) = 0xd;
  *(undefined1 *)(stack0xffffffffffffff80 + 0xe5) = 10;
  cio_write_buffer_const_element_init
            ((cio_write_buffer *)(stack0xffffffffffffff80 + 0xe8),
             "Upgrade: websocket\r\nSec-WebSocket-Accept: ",0x2a);
  (**(code **)(context._96_8_ + 0x10))(context._96_8_,stack0xffffffffffffff80 + 0xe8);
  cio_write_buffer_const_element_init
            ((cio_write_buffer *)(stack0xffffffffffffff80 + 0x108),
             (void *)(stack0xffffffffffffff80 + 200),0x1e);
  (**(code **)(context._96_8_ + 0x10))(context._96_8_,stack0xffffffffffffff80 + 0x108);
  if (*(int *)(stack0xffffffffffffff80 + 0xc4) != -1) {
    cio_write_buffer_const_element_init
              ((cio_write_buffer *)(stack0xffffffffffffff80 + 0x128),"Sec-Websocket-Protocol: ",0x18
              );
    __s = *(char **)(*(long *)(stack0xffffffffffffff80 + 0xb0) +
                    (long)*(int *)(stack0xffffffffffffff80 + 0xc4) * 8);
    wbe = (cio_write_buffer *)(stack0xffffffffffffff80 + 0x148);
    length = strlen(__s);
    cio_write_buffer_const_element_init(wbe,__s,length);
    cio_write_buffer_const_element_init
              ((cio_write_buffer *)(stack0xffffffffffffff80 + 0x168),"\r\n",2);
    (**(code **)(context._96_8_ + 0x10))(context._96_8_,stack0xffffffffffffff80 + 0x128);
    (**(code **)(context._96_8_ + 0x10))(context._96_8_,stack0xffffffffffffff80 + 0x148);
    (**(code **)(context._96_8_ + 0x10))(context._96_8_,stack0xffffffffffffff80 + 0x168);
  }
  cVar1 = (**(code **)(context._96_8_ + 8))(context._96_8_,0x65,0,response_written);
  return cVar1;
}

Assistant:

static enum cio_error send_upgrade_response(struct cio_http_client *client)
{
	struct sha1_context context;
	sha1_reset(&context);

	struct cio_websocket_location_handler *websocket = cio_container_of(client->current_handler, struct cio_websocket_location_handler, http_location);
	sha1_input(&context, websocket->sec_websocket_key, CIO_SEC_WEB_SOCKET_GUID_LENGTH + CIO_SEC_WEB_SOCKET_KEY_LENGTH);
	uint8_t sha1_buffer[SHA1_HASH_SIZE];
	sha1_result(&context, sha1_buffer);
	cio_b64_encode_buffer(sha1_buffer, SHA1_HASH_SIZE, websocket->accept_value);
	websocket->accept_value[CIO_SEC_WEBSOCKET_ACCEPT_LENGTH - 2] = '\r';
	websocket->accept_value[CIO_SEC_WEBSOCKET_ACCEPT_LENGTH - 1] = '\n';

	static const char UPGRADE_HEADER[] =
	    "Upgrade: websocket" CIO_CRLF
	    "Sec-WebSocket-Accept: ";

	cio_write_buffer_const_element_init(&websocket->wb_upgrade_header, UPGRADE_HEADER, sizeof(UPGRADE_HEADER) - 1);
	client->add_response_header(client, &websocket->wb_upgrade_header);
	cio_write_buffer_const_element_init(&websocket->wb_accept_value, &websocket->accept_value, sizeof(websocket->accept_value));
	client->add_response_header(client, &websocket->wb_accept_value);

	if (websocket->chosen_subprotocol != -1) {
		static const char WS_PROTOCOL[] =
		    "Sec-Websocket-Protocol: ";
		cio_write_buffer_const_element_init(&websocket->wb_protocol_field, WS_PROTOCOL, sizeof(WS_PROTOCOL) - 1);
		const char *chosen_subprotocol = websocket->subprotocols[websocket->chosen_subprotocol];
		cio_write_buffer_const_element_init(&websocket->wb_protocol_value, chosen_subprotocol, strlen(chosen_subprotocol));
		cio_write_buffer_const_element_init(&websocket->wb_protocol_end, CIO_CRLF, strlen(CIO_CRLF));
		client->add_response_header(client, &websocket->wb_protocol_field);
		client->add_response_header(client, &websocket->wb_protocol_value);
		client->add_response_header(client, &websocket->wb_protocol_end);
	}

	return client->write_response(client, CIO_HTTP_STATUS_SWITCHING_PROTOCOLS, NULL, response_written);
}